

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

void embree::avx2::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  uint uVar28;
  uint uVar29;
  Scene *pSVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [36];
  undefined1 auVar48 [36];
  undefined1 auVar49 [36];
  undefined1 auVar50 [36];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [28];
  undefined1 auVar62 [64];
  undefined1 auVar63 [28];
  undefined1 auVar65 [64];
  undefined1 auVar66 [28];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [28];
  undefined1 auVar72 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_2e8;
  float local_2e4;
  RTCFilterFunctionNArguments local_2e0;
  float local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a4;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  undefined1 local_280 [32];
  Scene *local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0 [4];
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  undefined1 local_80 [32];
  undefined1 auVar54 [64];
  undefined1 auVar57 [64];
  undefined1 auVar61 [32];
  undefined1 auVar64 [32];
  
  pSVar30 = context->scene;
  local_a0[0] = sphere->sharedGeomID;
  pGVar6 = (pSVar30->geometries).items[local_a0[0]].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[4] * _Var8);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[0] * _Var8);
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[5] * _Var8);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[1] * _Var8);
  auVar42._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[6] * _Var8);
  auVar42._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[2] * _Var8);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[7] * _Var8);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[3] * _Var8);
  auVar44 = vunpcklps_avx(auVar34,auVar42);
  auVar37 = vunpckhps_avx(auVar34,auVar42);
  auVar45 = vunpcklps_avx(auVar40,auVar68);
  auVar68 = vunpckhps_avx(auVar40,auVar68);
  auVar18 = vunpcklps_avx(auVar44,auVar45);
  auVar44 = vunpckhps_avx(auVar44,auVar45);
  auVar45 = vunpcklps_avx(auVar37,auVar68);
  auVar34 = vunpckhps_avx(auVar37,auVar68);
  bVar5 = sphere->numPrimitives;
  auVar35._1_3_ = 0;
  auVar35[0] = bVar5;
  auVar35[4] = bVar5;
  auVar35._5_3_ = 0;
  auVar35[8] = bVar5;
  auVar35._9_3_ = 0;
  auVar35[0xc] = bVar5;
  auVar35._13_3_ = 0;
  auVar35[0x10] = bVar5;
  auVar35._17_3_ = 0;
  auVar35[0x14] = bVar5;
  auVar35._21_3_ = 0;
  auVar35[0x18] = bVar5;
  auVar35._25_3_ = 0;
  auVar35[0x1c] = bVar5;
  auVar35._29_3_ = 0;
  auVar35 = vpcmpgtd_avx2(auVar35,_DAT_01fb4ba0);
  local_a0[1] = local_a0[0];
  local_a0[2] = local_a0[0];
  local_a0[3] = local_a0[0];
  uStack_90 = local_a0[0];
  uStack_8c = local_a0[0];
  uStack_88 = local_a0[0];
  uStack_84 = local_a0[0];
  auVar33 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 8),
                         *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).org.field_0 + 8),8);
  auVar33 = vdpps_avx(auVar33,auVar33,0x7f);
  auVar17 = vrcpss_avx(auVar33,auVar33);
  auVar33 = vfnmadd213ss_fma(auVar33,auVar17,ZEXT416(0x40000000));
  fVar16 = auVar17._0_4_ * auVar33._0_4_;
  uVar32 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar52._4_4_ = uVar32;
  auVar52._0_4_ = uVar32;
  auVar52._8_4_ = uVar32;
  auVar52._12_4_ = uVar32;
  auVar52._16_4_ = uVar32;
  auVar52._20_4_ = uVar32;
  auVar52._24_4_ = uVar32;
  auVar52._28_4_ = uVar32;
  auVar37 = vsubps_avx(auVar18,auVar52);
  uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar25._4_4_ = uVar32;
  auVar25._0_4_ = uVar32;
  auVar25._8_4_ = uVar32;
  auVar25._12_4_ = uVar32;
  auVar25._16_4_ = uVar32;
  auVar25._20_4_ = uVar32;
  auVar25._24_4_ = uVar32;
  auVar25._28_4_ = uVar32;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar55._16_4_ = uVar1;
  auVar55._20_4_ = uVar1;
  auVar55._24_4_ = uVar1;
  auVar55._28_4_ = uVar1;
  auVar68 = vsubps_avx(auVar44,auVar25);
  auVar44 = vsubps_avx(auVar45,auVar55);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar61._4_4_ = fVar2;
  auVar61._0_4_ = fVar2;
  auVar61._8_4_ = fVar2;
  auVar61._12_4_ = fVar2;
  auVar61._16_4_ = fVar2;
  auVar61._20_4_ = fVar2;
  auVar61._24_4_ = fVar2;
  auVar61._28_4_ = fVar2;
  auVar62 = ZEXT3264(auVar61);
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar64._4_4_ = fVar3;
  auVar64._0_4_ = fVar3;
  auVar64._8_4_ = fVar3;
  auVar64._12_4_ = fVar3;
  auVar64._16_4_ = fVar3;
  auVar64._20_4_ = fVar3;
  auVar64._24_4_ = fVar3;
  auVar64._28_4_ = fVar3;
  auVar65 = ZEXT3264(auVar64);
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar67 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  auVar45._4_4_ = fVar4 * auVar44._4_4_;
  auVar45._0_4_ = fVar4 * auVar44._0_4_;
  auVar45._8_4_ = fVar4 * auVar44._8_4_;
  auVar45._12_4_ = fVar4 * auVar44._12_4_;
  auVar45._16_4_ = fVar4 * auVar44._16_4_;
  auVar45._20_4_ = fVar4 * auVar44._20_4_;
  auVar45._24_4_ = fVar4 * auVar44._24_4_;
  auVar45._28_4_ = uVar32;
  auVar33 = vfmadd231ps_fma(auVar45,auVar68,auVar64);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar37,auVar61);
  auVar46._0_4_ = fVar16 * auVar33._0_4_;
  auVar46._4_4_ = fVar16 * auVar33._4_4_;
  auVar46._8_4_ = fVar16 * auVar33._8_4_;
  auVar46._12_4_ = fVar16 * auVar33._12_4_;
  auVar46._16_4_ = fVar16 * 0.0;
  auVar46._20_4_ = fVar16 * 0.0;
  auVar46._24_4_ = fVar16 * 0.0;
  auVar46._28_4_ = 0;
  auVar18._4_4_ = fVar2 * auVar46._4_4_;
  auVar18._0_4_ = fVar2 * auVar46._0_4_;
  auVar18._8_4_ = fVar2 * auVar46._8_4_;
  auVar18._12_4_ = fVar2 * auVar46._12_4_;
  auVar18._16_4_ = fVar2 * auVar46._16_4_;
  auVar18._20_4_ = fVar2 * auVar46._20_4_;
  auVar18._24_4_ = fVar2 * auVar46._24_4_;
  auVar18._28_4_ = uVar1;
  auVar59._0_4_ = fVar3 * auVar46._0_4_;
  auVar59._4_4_ = fVar3 * auVar46._4_4_;
  auVar59._8_4_ = fVar3 * auVar46._8_4_;
  auVar59._12_4_ = fVar3 * auVar46._12_4_;
  auVar59._16_4_ = fVar3 * auVar46._16_4_;
  auVar59._20_4_ = fVar3 * auVar46._20_4_;
  auVar59._28_36_ = in_ZMM8._28_36_;
  auVar59._24_4_ = fVar3 * auVar46._24_4_;
  auVar54._0_4_ = fVar4 * auVar46._0_4_;
  auVar54._4_4_ = fVar4 * auVar46._4_4_;
  auVar54._8_4_ = fVar4 * auVar46._8_4_;
  auVar54._12_4_ = fVar4 * auVar46._12_4_;
  auVar54._16_4_ = fVar4 * auVar46._16_4_;
  auVar54._20_4_ = fVar4 * auVar46._20_4_;
  auVar54._28_36_ = in_ZMM9._28_36_;
  auVar54._24_4_ = fVar4 * auVar46._24_4_;
  auVar45 = vsubps_avx(auVar37,auVar18);
  auVar69 = ZEXT3264(auVar45);
  auVar18 = vsubps_avx(auVar68,auVar59._0_32_);
  auVar70 = ZEXT3264(auVar18);
  auVar44 = vsubps_avx(auVar44,auVar54._0_32_);
  auVar59 = ZEXT3264(auVar44);
  auVar37._4_4_ = auVar44._4_4_ * auVar44._4_4_;
  auVar37._0_4_ = auVar44._0_4_ * auVar44._0_4_;
  auVar37._8_4_ = auVar44._8_4_ * auVar44._8_4_;
  auVar37._12_4_ = auVar44._12_4_ * auVar44._12_4_;
  auVar37._16_4_ = auVar44._16_4_ * auVar44._16_4_;
  auVar37._20_4_ = auVar44._20_4_ * auVar44._20_4_;
  auVar37._24_4_ = auVar44._24_4_ * auVar44._24_4_;
  auVar37._28_4_ = auVar68._28_4_;
  auVar33 = vfmadd231ps_fma(auVar37,auVar18,auVar18);
  auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar45,auVar45);
  auVar19._4_4_ = auVar34._4_4_ * auVar34._4_4_;
  auVar19._0_4_ = auVar34._0_4_ * auVar34._0_4_;
  auVar19._8_4_ = auVar34._8_4_ * auVar34._8_4_;
  auVar19._12_4_ = auVar34._12_4_ * auVar34._12_4_;
  auVar19._16_4_ = auVar34._16_4_ * auVar34._16_4_;
  auVar19._20_4_ = auVar34._20_4_ * auVar34._20_4_;
  auVar19._24_4_ = auVar34._24_4_ * auVar34._24_4_;
  auVar19._28_4_ = auVar34._28_4_;
  auVar37 = vcmpps_avx(ZEXT1632(auVar33),auVar19,2);
  auVar68 = auVar35 & auVar37;
  if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar68 >> 0x7f,0) != '\0') ||
        (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar68 >> 0xbf,0) != '\0') ||
      (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar68[0x1f] < '\0') {
    auVar37 = vandps_avx(auVar37,auVar35);
    auVar17 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
    auVar37 = vsubps_avx(auVar19,ZEXT1632(auVar33));
    auVar20._4_4_ = fVar16 * auVar37._4_4_;
    auVar20._0_4_ = fVar16 * auVar37._0_4_;
    auVar20._8_4_ = fVar16 * auVar37._8_4_;
    auVar20._12_4_ = fVar16 * auVar37._12_4_;
    auVar20._16_4_ = fVar16 * auVar37._16_4_;
    auVar20._20_4_ = fVar16 * auVar37._20_4_;
    auVar20._24_4_ = fVar16 * auVar37._24_4_;
    auVar20._28_4_ = auVar37._28_4_;
    auVar34 = vsqrtps_avx(auVar20);
    auVar72 = ZEXT3264(auVar34);
    auVar35 = vsubps_avx(auVar46,auVar34);
    auVar53._0_4_ = auVar34._0_4_ + auVar46._0_4_;
    auVar53._4_4_ = auVar34._4_4_ + auVar46._4_4_;
    auVar53._8_4_ = auVar34._8_4_ + auVar46._8_4_;
    auVar53._12_4_ = auVar34._12_4_ + auVar46._12_4_;
    auVar53._16_4_ = auVar34._16_4_ + auVar46._16_4_;
    auVar53._20_4_ = auVar34._20_4_ + auVar46._20_4_;
    auVar53._24_4_ = auVar34._24_4_ + auVar46._24_4_;
    auVar53._28_4_ = auVar34._28_4_ + 0.0;
    auVar54 = ZEXT3264(auVar53);
    uVar32 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar41._4_4_ = uVar32;
    auVar41._0_4_ = uVar32;
    auVar41._8_4_ = uVar32;
    auVar41._12_4_ = uVar32;
    auVar41._16_4_ = uVar32;
    auVar41._20_4_ = uVar32;
    auVar41._24_4_ = uVar32;
    auVar41._28_4_ = uVar32;
    auVar37 = vcmpps_avx(auVar41,auVar35,2);
    fVar16 = (ray->super_RayK<1>).tfar;
    auVar26._4_4_ = fVar16;
    auVar26._0_4_ = fVar16;
    auVar26._8_4_ = fVar16;
    auVar26._12_4_ = fVar16;
    auVar26._16_4_ = fVar16;
    auVar26._20_4_ = fVar16;
    auVar26._24_4_ = fVar16;
    auVar26._28_4_ = fVar16;
    auVar68 = vcmpps_avx(auVar35,auVar26,2);
    auVar37 = vandps_avx(auVar37,auVar68);
    auVar33 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
    local_250 = vpand_avx(auVar33,auVar17);
    auVar37 = vcmpps_avx(auVar41,auVar53,2);
    auVar68 = vcmpps_avx(auVar53,auVar26,2);
    auVar37 = vandps_avx(auVar37,auVar68);
    auVar33 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
    local_190 = vpand_avx(auVar33,auVar17);
    auVar33 = vpor_avx(local_250,local_190);
    auVar37 = vpmovsxwd_avx2(auVar33);
    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0x7f,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0xbf,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0')
    {
      auVar68 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      auVar39 = ZEXT3264(auVar68);
      auVar19 = vpmovsxwd_avx2(local_250);
      local_240 = vblendvps_avx(auVar53,auVar35,auVar19);
      auVar43._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
      auVar43._8_4_ = -auVar34._8_4_;
      auVar43._12_4_ = -auVar34._12_4_;
      auVar43._16_4_ = -auVar34._16_4_;
      auVar43._20_4_ = -auVar34._20_4_;
      auVar43._24_4_ = -auVar34._24_4_;
      auVar43._28_4_ = -auVar34._28_4_;
      auVar34 = vblendvps_avx(auVar34,auVar43,auVar19);
      fVar16 = auVar34._0_4_;
      fVar10 = auVar34._4_4_;
      auVar21._4_4_ = fVar2 * fVar10;
      auVar21._0_4_ = fVar2 * fVar16;
      fVar11 = auVar34._8_4_;
      auVar21._8_4_ = fVar2 * fVar11;
      fVar12 = auVar34._12_4_;
      auVar21._12_4_ = fVar2 * fVar12;
      fVar13 = auVar34._16_4_;
      auVar21._16_4_ = fVar2 * fVar13;
      fVar14 = auVar34._20_4_;
      auVar21._20_4_ = fVar2 * fVar14;
      fVar15 = auVar34._24_4_;
      auVar21._24_4_ = fVar2 * fVar15;
      auVar21._28_4_ = 0x80000000;
      auVar22._4_4_ = fVar3 * fVar10;
      auVar22._0_4_ = fVar3 * fVar16;
      auVar22._8_4_ = fVar3 * fVar11;
      auVar22._12_4_ = fVar3 * fVar12;
      auVar22._16_4_ = fVar3 * fVar13;
      auVar22._20_4_ = fVar3 * fVar14;
      auVar22._24_4_ = fVar3 * fVar15;
      auVar22._28_4_ = auVar19._28_4_;
      auVar23._4_4_ = fVar4 * fVar10;
      auVar23._0_4_ = fVar4 * fVar16;
      auVar23._8_4_ = fVar4 * fVar11;
      auVar23._12_4_ = fVar4 * fVar12;
      auVar23._16_4_ = fVar4 * fVar13;
      auVar23._20_4_ = fVar4 * fVar14;
      auVar23._24_4_ = fVar4 * fVar15;
      auVar23._28_4_ = auVar34._28_4_;
      local_220 = vsubps_avx(auVar21,auVar45);
      local_200 = vsubps_avx(auVar22,auVar18);
      local_1e0 = vsubps_avx(auVar23,auVar44);
      auVar51 = ZEXT3264(local_240);
      local_280 = auVar37;
      auVar44 = vpmovzxwd_avx2(auVar33);
      auVar44 = vpslld_avx2(auVar44,0x1f);
      auVar56._8_4_ = 0x7f800000;
      auVar56._0_8_ = 0x7f8000007f800000;
      auVar56._12_4_ = 0x7f800000;
      auVar56._16_4_ = 0x7f800000;
      auVar56._20_4_ = 0x7f800000;
      auVar56._24_4_ = 0x7f800000;
      auVar56._28_4_ = 0x7f800000;
      auVar57 = ZEXT3264(auVar56);
      auVar44 = vblendvps_avx(auVar56,local_240,auVar44);
      auVar45 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar45 = vminps_avx(auVar44,auVar45);
      auVar18 = vshufpd_avx(auVar45,auVar45,5);
      auVar45 = vminps_avx(auVar45,auVar18);
      auVar34 = vpermpd_avx2(auVar45,0x4e);
      auVar45 = vminps_avx(auVar45,auVar34);
      auVar44 = vcmpps_avx(auVar44,auVar45,0);
      auVar18 = auVar37 & auVar44;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar37 = vandps_avx(auVar44,auVar37);
      }
      auVar33 = auVar68._0_16_;
      uVar27 = vextractps_avx(auVar33,1);
      uVar28 = vmovmskps_avx(auVar37);
      uVar29 = 0;
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
        uVar29 = uVar29 + 1;
      }
      auVar58 = ZEXT1664(auVar33);
LAB_0129cfe2:
      uVar28 = auVar34._28_4_;
      auVar49 = ZEXT436(uVar28);
      uVar24 = auVar45._28_4_;
      auVar47 = ZEXT436(uVar24);
      auVar37 = auVar59._0_32_;
      auVar44 = auVar70._0_32_;
      auVar68 = auVar69._0_32_;
      auVar66 = auVar67._0_28_;
      auVar63 = auVar65._0_28_;
      auVar50 = ZEXT436(uVar28);
      auVar71 = auVar72._0_28_;
      auVar60 = auVar62._0_28_;
      auVar48 = ZEXT436(uVar24);
      uVar31 = (ulong)uVar29;
      local_298 = local_a0[uVar31];
      pGVar6 = (pSVar30->geometries).items[local_298].ptr;
      if ((pGVar6->mask & uVar27) == 0) {
        *(undefined4 *)(local_280 + uVar31 * 4) = 0;
        auVar48 = ZEXT436(uVar24);
        auVar50 = ZEXT436(uVar28);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar58 = ZEXT464((uint)*(float *)(local_240 + uVar31 * 4));
          (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar31 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar31 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar31 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar31 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar31];
          ray->geomID = local_298;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          uVar32 = SUB324(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
          uVar27 = (ray->super_RayK<1>).mask;
LAB_0129d337:
          auVar17 = vpand_avx(local_190,local_250);
          auVar36._4_4_ = uVar32;
          auVar36._0_4_ = uVar32;
          auVar36._8_4_ = uVar32;
          auVar36._12_4_ = uVar32;
          auVar36._16_4_ = uVar32;
          auVar36._20_4_ = uVar32;
          auVar36._24_4_ = uVar32;
          auVar36._28_4_ = uVar32;
          local_240 = auVar54._0_32_;
          auVar45 = vcmpps_avx(local_240,auVar36,2);
          auVar33 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
          auVar33 = vpand_avx(auVar33,auVar17);
          auVar45 = vpmovzxwd_avx2(auVar33);
          auVar45 = vpslld_avx2(auVar45,0x1f);
          if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar45 >> 0x7f,0) == '\0') &&
                (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar45 >> 0xbf,0) == '\0') &&
              (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar45[0x1f]) {
            return;
          }
          local_280 = vpsrad_avx2(auVar45,0x1f);
          fVar2 = auVar71._0_4_;
          fVar3 = auVar71._4_4_;
          auVar62._4_4_ = auVar60._4_4_ * fVar3;
          auVar62._0_4_ = auVar60._0_4_ * fVar2;
          fVar4 = auVar71._8_4_;
          auVar62._8_4_ = auVar60._8_4_ * fVar4;
          fVar16 = auVar71._12_4_;
          auVar62._12_4_ = auVar60._12_4_ * fVar16;
          fVar10 = auVar71._16_4_;
          auVar62._16_4_ = auVar60._16_4_ * fVar10;
          fVar11 = auVar71._20_4_;
          auVar62._20_4_ = auVar60._20_4_ * fVar11;
          fVar12 = auVar71._24_4_;
          auVar62._24_4_ = auVar60._24_4_ * fVar12;
          auVar62._28_36_ = auVar48;
          auVar65._4_4_ = auVar63._4_4_ * fVar3;
          auVar65._0_4_ = auVar63._0_4_ * fVar2;
          auVar65._8_4_ = auVar63._8_4_ * fVar4;
          auVar65._12_4_ = auVar63._12_4_ * fVar16;
          auVar65._16_4_ = auVar63._16_4_ * fVar10;
          auVar65._20_4_ = auVar63._20_4_ * fVar11;
          auVar65._24_4_ = auVar63._24_4_ * fVar12;
          auVar65._28_36_ = auVar50;
          auVar67._4_4_ = auVar66._4_4_ * fVar3;
          auVar67._0_4_ = auVar66._0_4_ * fVar2;
          auVar67._8_4_ = auVar66._8_4_ * fVar4;
          auVar67._12_4_ = auVar66._12_4_ * fVar16;
          auVar67._16_4_ = auVar66._16_4_ * fVar10;
          auVar67._20_4_ = auVar66._20_4_ * fVar11;
          auVar67._24_4_ = auVar66._24_4_ * fVar12;
          auVar67._28_36_ = auVar51._28_36_;
          local_220 = vsubps_avx(auVar62._0_32_,auVar68);
          local_200 = vsubps_avx(auVar65._0_32_,auVar44);
          local_1e0 = vsubps_avx(auVar67._0_32_,auVar37);
          pSVar30 = context->scene;
          auVar37 = vblendvps_avx(auVar57._0_32_,local_240,auVar45);
          auVar68 = vshufps_avx(auVar37,auVar37,0xb1);
          auVar68 = vminps_avx(auVar37,auVar68);
          auVar44 = vshufpd_avx(auVar68,auVar68,5);
          auVar68 = vminps_avx(auVar68,auVar44);
          auVar44 = vpermpd_avx2(auVar68,0x4e);
          auVar68 = vminps_avx(auVar68,auVar44);
          auVar37 = vcmpps_avx(auVar37,auVar68,0);
          auVar17 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
          auVar33 = vpand_avx(auVar17,auVar33);
          auVar37 = vpmovzxwd_avx2(auVar33);
          auVar37 = vpslld_avx2(auVar37,0x1f);
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0x7f,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar37 >> 0xbf,0) == '\0') &&
              (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar37[0x1f]) {
            auVar37 = local_280;
          }
          uVar28 = vmovmskps_avx(auVar37);
          uVar29 = 0;
          for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
            uVar29 = uVar29 + 1;
          }
          do {
            uVar31 = (ulong)uVar29;
            local_298 = local_a0[uVar31];
            pGVar6 = (pSVar30->geometries).items[local_298].ptr;
            if ((pGVar6->mask & uVar27) == 0) {
              *(undefined4 *)(local_280 + uVar31 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar31 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar31 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar31 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar31 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar31];
                ray->geomID = local_298;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_250._0_8_ = pSVar30;
              local_2e4 = auVar58._0_4_;
              local_1c0 = auVar54._0_32_;
              local_2b0 = *(float *)(local_220 + uVar31 * 4);
              local_2ac = *(undefined4 *)(local_200 + uVar31 * 4);
              local_2a8 = *(undefined4 *)(local_1e0 + uVar31 * 4);
              local_2a4 = 0;
              local_29c = (sphere->primIDs).field_0.i[uVar31];
              local_294 = context->user->instID[0];
              local_290 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar31 * 4);
              local_2e8 = -1;
              local_2e0.valid = &local_2e8;
              local_2e0.geometryUserPtr = pGVar6->userPtr;
              local_2e0.context = context->user;
              local_2e0.ray = (RTCRayN *)ray;
              local_2e0.hit = (RTCHitN *)&local_2b0;
              local_2e0.N = 1;
              if ((pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar6->intersectionFilterN)(&local_2e0), *local_2e0.valid != 0)) {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                    && ((*p_Var9)(&local_2e0), *local_2e0.valid == 0)))) goto LAB_0129d609;
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_2e0.hit;
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_2e0.hit + 4);
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_2e0.hit + 8);
                *(float *)((long)local_2e0.ray + 0x3c) = *(float *)(local_2e0.hit + 0xc);
                *(float *)((long)local_2e0.ray + 0x40) = *(float *)(local_2e0.hit + 0x10);
                *(float *)((long)local_2e0.ray + 0x44) = *(float *)(local_2e0.hit + 0x14);
                *(float *)((long)local_2e0.ray + 0x48) = *(float *)(local_2e0.hit + 0x18);
                *(float *)((long)local_2e0.ray + 0x4c) = *(float *)(local_2e0.hit + 0x1c);
                *(float *)((long)local_2e0.ray + 0x50) = *(float *)(local_2e0.hit + 0x20);
              }
              else {
LAB_0129d609:
                (ray->super_RayK<1>).tfar = local_2e4;
              }
              auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pSVar30 = (Scene *)local_250._0_8_;
              *(undefined4 *)(local_280 + uVar31 * 4) = 0;
              fVar2 = (ray->super_RayK<1>).tfar;
              auVar38._4_4_ = fVar2;
              auVar38._0_4_ = fVar2;
              auVar38._8_4_ = fVar2;
              auVar38._12_4_ = fVar2;
              auVar38._16_4_ = fVar2;
              auVar38._20_4_ = fVar2;
              auVar38._24_4_ = fVar2;
              auVar38._28_4_ = fVar2;
              auVar54 = ZEXT3264(local_1c0);
              auVar37 = vcmpps_avx(local_1c0,auVar38,2);
              local_280 = vandps_avx(auVar37,local_280);
              uVar27 = (ray->super_RayK<1>).mask;
              auVar58 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
            }
            if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_280 >> 0x7f,0) == '\0') &&
                  (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_280 >> 0xbf,0) == '\0') &&
                (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_280[0x1f]) {
              return;
            }
            auVar37 = vblendvps_avx(auVar57._0_32_,auVar54._0_32_,local_280);
            auVar68 = vshufps_avx(auVar37,auVar37,0xb1);
            auVar68 = vminps_avx(auVar37,auVar68);
            auVar44 = vshufpd_avx(auVar68,auVar68,5);
            auVar68 = vminps_avx(auVar68,auVar44);
            auVar44 = vpermpd_avx2(auVar68,0x4e);
            auVar68 = vminps_avx(auVar68,auVar44);
            auVar68 = vcmpps_avx(auVar37,auVar68,0);
            auVar44 = local_280 & auVar68;
            auVar37 = local_280;
            if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar44 >> 0x7f,0) != '\0') ||
                  (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0xbf,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar44[0x1f] < '\0') {
              auVar37 = vandps_avx(auVar68,local_280);
            }
            uVar28 = vmovmskps_avx(auVar37);
            uVar29 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
              uVar29 = uVar29 + 1;
            }
          } while( true );
        }
        local_80 = auVar51._0_32_;
        local_180 = auVar72._0_32_;
        local_160 = auVar37;
        local_140 = auVar44;
        local_120 = auVar68;
        local_100 = auVar67._0_32_;
        local_e0 = auVar65._0_32_;
        local_c0 = auVar62._0_32_;
        local_2e4 = auVar58._0_4_;
        local_258 = pSVar30;
        local_1c0 = auVar54._0_32_;
        local_2b0 = *(float *)(local_220 + uVar31 * 4);
        local_2ac = *(undefined4 *)(local_200 + uVar31 * 4);
        local_2a8 = *(undefined4 *)(local_1e0 + uVar31 * 4);
        local_2a4 = 0;
        local_29c = (sphere->primIDs).field_0.i[uVar31];
        local_294 = context->user->instID[0];
        local_290 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar31 * 4);
        local_2e8 = -1;
        local_2e0.valid = &local_2e8;
        local_2e0.geometryUserPtr = pGVar6->userPtr;
        local_2e0.context = context->user;
        local_2e0.ray = (RTCRayN *)ray;
        local_2e0.hit = (RTCHitN *)&local_2b0;
        local_2e0.N = 1;
        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0129d12d:
          p_Var9 = context->args->filter;
          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
            auVar47 = (undefined1  [36])0x0;
            auVar49 = (undefined1  [36])0x0;
            (*p_Var9)(&local_2e0);
            if (*local_2e0.valid == 0) goto LAB_0129d213;
          }
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.x = *(float *)local_2e0.hit;
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2e0.hit + 4);
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2e0.hit + 8);
          *(float *)((long)local_2e0.ray + 0x3c) = *(float *)(local_2e0.hit + 0xc);
          *(float *)((long)local_2e0.ray + 0x40) = *(float *)(local_2e0.hit + 0x10);
          *(float *)((long)local_2e0.ray + 0x44) = *(float *)(local_2e0.hit + 0x14);
          *(float *)((long)local_2e0.ray + 0x48) = *(float *)(local_2e0.hit + 0x18);
          *(float *)((long)local_2e0.ray + 0x4c) = *(float *)(local_2e0.hit + 0x1c);
          *(float *)((long)local_2e0.ray + 0x50) = *(float *)(local_2e0.hit + 0x20);
        }
        else {
          auVar47 = SUB6036((undefined1  [60])0x0,0x18);
          auVar49 = SUB6036((undefined1  [60])0x0,0x18);
          (*pGVar6->intersectionFilterN)(&local_2e0);
          if (*local_2e0.valid != 0) goto LAB_0129d12d;
LAB_0129d213:
          (ray->super_RayK<1>).tfar = local_2e4;
        }
        pSVar30 = local_258;
        auVar54 = ZEXT3264(local_1c0);
        auVar57 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        auVar62 = ZEXT3264(local_c0);
        auVar65 = ZEXT3264(local_e0);
        auVar67 = ZEXT3264(local_100);
        auVar69 = ZEXT3264(local_120);
        auVar70 = ZEXT3264(local_140);
        auVar59 = ZEXT3264(local_160);
        auVar72 = ZEXT3264(local_180);
        *(undefined4 *)(local_280 + uVar31 * 4) = 0;
        fVar2 = (ray->super_RayK<1>).tfar;
        auVar44._4_4_ = fVar2;
        auVar44._0_4_ = fVar2;
        auVar44._8_4_ = fVar2;
        auVar44._12_4_ = fVar2;
        auVar44._16_4_ = fVar2;
        auVar44._20_4_ = fVar2;
        auVar44._24_4_ = fVar2;
        auVar44._28_4_ = fVar2;
        auVar51 = ZEXT3264(local_80);
        auVar37 = vcmpps_avx(local_80,auVar44,2);
        local_280 = vandps_avx(auVar37,local_280);
        auVar39 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
        uVar27 = (ray->super_RayK<1>).mask;
        auVar58 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar48 = auVar47;
        auVar50 = auVar49;
      }
      uVar32 = auVar39._0_4_;
      auVar37 = auVar59._0_32_;
      auVar44 = auVar70._0_32_;
      auVar68 = auVar69._0_32_;
      auVar66 = auVar67._0_28_;
      auVar63 = auVar65._0_28_;
      auVar71 = auVar72._0_28_;
      auVar60 = auVar62._0_28_;
      if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_280 >> 0x7f,0) == '\0') &&
            (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_280 >> 0xbf,0) == '\0') &&
          (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_280[0x1f]) goto LAB_0129d337;
      auVar37 = vblendvps_avx(auVar57._0_32_,auVar51._0_32_,local_280);
      auVar68 = vshufps_avx(auVar37,auVar37,0xb1);
      auVar68 = vminps_avx(auVar37,auVar68);
      auVar44 = vshufpd_avx(auVar68,auVar68,5);
      auVar68 = vminps_avx(auVar68,auVar44);
      auVar34 = vpermpd_avx2(auVar68,0x4e);
      auVar45 = vminps_avx(auVar68,auVar34);
      auVar68 = vcmpps_avx(auVar37,auVar45,0);
      auVar44 = local_280 & auVar68;
      auVar37 = local_280;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar44 >> 0x7f,0) != '\0') ||
            (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar44 >> 0xbf,0) != '\0') ||
          (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar44[0x1f] < '\0') {
        auVar37 = vandps_avx(auVar68,local_280);
      }
      uVar28 = vmovmskps_avx(auVar37);
      uVar29 = 0;
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
        uVar29 = uVar29 + 1;
      }
      goto LAB_0129cfe2;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }